

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_getdate.c
# Opt level: O0

int timephrase(gdstate *gds)

{
  gdstate *gds_local;
  
  if ((((gds->tokenp->token == 0x10b) && (gds->tokenp[1].token == 0x3a)) &&
      (gds->tokenp[2].token == 0x10b)) &&
     ((gds->tokenp[3].token == 0x3a && (gds->tokenp[4].token == 0x10b)))) {
    gds->HaveTime = gds->HaveTime + 1;
    gds->Hour = gds->tokenp->value;
    gds->Minutes = gds->tokenp[2].value;
    gds->Seconds = gds->tokenp[4].value;
    gds->tokenp = gds->tokenp + 5;
  }
  else if ((gds->tokenp->token == 0x10b) &&
          ((gds->tokenp[1].token == 0x3a && (gds->tokenp[2].token == 0x10b)))) {
    gds->HaveTime = gds->HaveTime + 1;
    gds->Hour = gds->tokenp->value;
    gds->Minutes = gds->tokenp[2].value;
    gds->Seconds = 0;
    gds->tokenp = gds->tokenp + 3;
  }
  else {
    if ((gds->tokenp->token != 0x10b) || (gds->tokenp[1].token != 0x107)) {
      return 0;
    }
    gds->HaveTime = gds->HaveTime + 1;
    gds->Hour = gds->tokenp->value;
    gds->Seconds = 0;
    gds->Minutes = 0;
    gds->tokenp = gds->tokenp + 1;
  }
  if (gds->tokenp->token == 0x107) {
    if (gds->Hour == 0xc) {
      gds->Hour = 0;
    }
    if (gds->tokenp->value == 1) {
      gds->Hour = gds->Hour + 0xc;
    }
    gds->tokenp = gds->tokenp + 1;
  }
  if ((gds->tokenp->token == 0x2b) && (gds->tokenp[1].token == 0x10b)) {
    gds->HaveZone = gds->HaveZone + 1;
    gds->DSTmode = DSToff;
    gds->Timezone = -((gds->tokenp[1].value / 100) * 0xe10 + (gds->tokenp[1].value % 100) * 0x3c);
    gds->tokenp = gds->tokenp + 2;
  }
  if ((gds->tokenp->token == 0x2d) && (gds->tokenp[1].token == 0x10b)) {
    gds->HaveZone = gds->HaveZone + 1;
    gds->DSTmode = DSToff;
    gds->Timezone = (gds->tokenp[1].value / 100) * 0xe10 + (gds->tokenp[1].value % 100) * 0x3c;
    gds->tokenp = gds->tokenp + 2;
  }
  return 1;
}

Assistant:

static int
timephrase(struct gdstate *gds)
{
	if (gds->tokenp[0].token == tUNUMBER
	    && gds->tokenp[1].token == ':'
	    && gds->tokenp[2].token == tUNUMBER
	    && gds->tokenp[3].token == ':'
	    && gds->tokenp[4].token == tUNUMBER) {
		/* "12:14:18" or "22:08:07" */
		++gds->HaveTime;
		gds->Hour = gds->tokenp[0].value;
		gds->Minutes = gds->tokenp[2].value;
		gds->Seconds = gds->tokenp[4].value;
		gds->tokenp += 5;
	}
	else if (gds->tokenp[0].token == tUNUMBER
	    && gds->tokenp[1].token == ':'
	    && gds->tokenp[2].token == tUNUMBER) {
		/* "12:14" or "22:08" */
		++gds->HaveTime;
		gds->Hour = gds->tokenp[0].value;
		gds->Minutes = gds->tokenp[2].value;
		gds->Seconds = 0;
		gds->tokenp += 3;
	}
	else if (gds->tokenp[0].token == tUNUMBER
	    && gds->tokenp[1].token == tAMPM) {
		/* "7" is a time if it's followed by "am" or "pm" */
		++gds->HaveTime;
		gds->Hour = gds->tokenp[0].value;
		gds->Minutes = gds->Seconds = 0;
		/* We'll handle the AM/PM below. */
		gds->tokenp += 1;
	} else {
		/* We can't handle this. */
		return 0;
	}

	if (gds->tokenp[0].token == tAMPM) {
		/* "7:12pm", "12:20:13am" */
		if (gds->Hour == 12)
			gds->Hour = 0;
		if (gds->tokenp[0].value == tPM)
			gds->Hour += 12;
		gds->tokenp += 1;
	}
	if (gds->tokenp[0].token == '+'
	    && gds->tokenp[1].token == tUNUMBER) {
		/* "7:14+0700" */
		gds->HaveZone++;
		gds->DSTmode = DSToff;
		gds->Timezone = - ((gds->tokenp[1].value / 100) * HOUR
		    + (gds->tokenp[1].value % 100) * MINUTE);
		gds->tokenp += 2;
	}
	if (gds->tokenp[0].token == '-'
	    && gds->tokenp[1].token == tUNUMBER) {
		/* "19:14:12-0530" */
		gds->HaveZone++;
		gds->DSTmode = DSToff;
		gds->Timezone = + ((gds->tokenp[1].value / 100) * HOUR
		    + (gds->tokenp[1].value % 100) * MINUTE);
		gds->tokenp += 2;
	}
	return 1;
}